

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void enterblock(FuncState *fs,BlockCnt *bl,lu_byte isloop)

{
  Dyndata *pDVar1;
  BlockCnt *pBVar2;
  bool bVar3;
  
  bl->isloop = isloop;
  bl->nactvar = fs->nactvar;
  pDVar1 = fs->ls->dyd;
  bl->firstlabel = (pDVar1->label).n;
  bl->firstgoto = (pDVar1->gt).n;
  bl->upval = '\0';
  pBVar2 = fs->bl;
  if (pBVar2 == (BlockCnt *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = pBVar2->insidetbc != '\0';
  }
  bl->insidetbc = bVar3;
  bl->previous = pBVar2;
  fs->bl = bl;
  return;
}

Assistant:

static void enterblock (FuncState *fs, BlockCnt *bl, lu_byte isloop) {
  bl->isloop = isloop;
  bl->nactvar = fs->nactvar;
  bl->firstlabel = fs->ls->dyd->label.n;
  bl->firstgoto = fs->ls->dyd->gt.n;
  bl->upval = 0;
  bl->insidetbc = (fs->bl != NULL && fs->bl->insidetbc);
  bl->previous = fs->bl;
  fs->bl = bl;
  lua_assert(fs->freereg == luaY_nvarstack(fs));
}